

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadGrou_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  Node *msh;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _Elt_pointer psVar4;
  ChunkInfo *pCVar5;
  COBImporter *this_00;
  chunk_guard cn;
  chunk_guard local_60;
  element_type *local_48;
  undefined1 auStack_40 [8];
  shared_ptr<Assimp::COB::Node> local_38;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Grou");
    return;
  }
  local_60.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar5 = nfo;
  local_60.nfo = nfo;
  local_60.reader = reader;
  std::make_shared<Assimp::COB::Group>();
  this_00 = (COBImporter *)auStack_40;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_40;
  local_48 = (element_type *)0x0;
  auStack_40 = (undefined1  [8])0x0;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  psVar4 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar5 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar4 = (_Elt_pointer)(*(long *)&pCVar5[-1].version + 0x200);
  }
  msh = psVar4[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar1;
  (msh->super_ChunkInfo).version = uVar2;
  (msh->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary(this_00,msh,reader,pCVar5);
  chunk_guard::~chunk_guard(&local_60);
  return;
}

Assistant:

void COBImporter::ReadGrou_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Grou");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::make_shared<Group>());
    Group& msh = (Group&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);
}